

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetReservedToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->cursor_;
  if (pbVar1 < this->buffer_end_) {
    do {
      if ((""[(ulong)*pbVar1 + 1] & 1U) == 0) break;
      pbVar1 = pbVar1 + 1;
      this->cursor_ = (char *)pbVar1;
    } while (pbVar1 != (byte *)this->buffer_end_);
  }
  TextToken(__return_storage_ptr__,this,Reserved,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetReservedToken() {
  ReadReservedChars();
  return TextToken(TokenType::Reserved);
}